

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O2

GCstr * lj_str_new(lua_State *L,char *str,size_t lenx)

{
  char *pcVar1;
  char cVar2;
  uint64_t uVar3;
  long lVar4;
  ulong uVar5;
  uint8_t uVar6;
  StrHash hashc;
  int iVar7;
  GCstr *pGVar8;
  uint64_t uVar9;
  uint uVar10;
  GCstr *pGVar11;
  uint uVar12;
  
  uVar3 = (L->glref).ptr64;
  if (lenx - 1 < 0x7ffffeff) {
    uVar12 = (uint)lenx;
    hashc = (*hash_sparse)(*(uint64_t *)(uVar3 + 0xb0),str,uVar12);
    pGVar8 = *(GCstr **)(*(long *)(uVar3 + 0x98) + (ulong)(hashc & *(uint *)(uVar3 + 0xa0)) * 8);
    uVar10 = 0;
    if (((ulong)pGVar8 & 1) == 0) {
      uVar6 = '\0';
      pGVar11 = pGVar8;
      uVar10 = 0;
    }
    else {
      hashc = (*hash_dense)(*(uint64_t *)(uVar3 + 0xb0),hashc,str,uVar12);
      pGVar11 = (GCstr *)(*(ulong *)(*(long *)(uVar3 + 0x98) +
                                    (ulong)(hashc & *(uint *)(uVar3 + 0xa0)) * 8) &
                         0xfffffffffffffffe);
      uVar6 = '\x01';
    }
    for (; pGVar11 != (GCstr *)0x0; pGVar11 = (GCstr *)(pGVar11->nextgc).gcptr64) {
      if ((pGVar11->hash == hashc) && (pGVar11->len == uVar12)) {
        iVar7 = bcmp(str,pGVar11 + 1,lenx);
        if (iVar7 == 0) {
          if ((~*(byte *)(uVar3 + 0x20) & pGVar11->marked & 3) == 0) {
            return pGVar11;
          }
          pGVar11->marked = pGVar11->marked ^ 3;
          return pGVar11;
        }
        uVar10 = uVar10 + 1;
      }
      uVar10 = uVar10 + 1;
    }
    if ((0x20 < uVar10) && (((ulong)pGVar8 & 1) == 0)) {
      pGVar8 = lj_str_rehash_chain(L,hashc,str,uVar12);
      return pGVar8;
    }
    pGVar8 = (GCstr *)lj_mem_realloc(L,(void *)0x0,0,(ulong)(uVar12 & 0x7ffffffc) + 0x1c);
    uVar3 = (L->glref).ptr64;
    pGVar8->marked = *(byte *)(uVar3 + 0x20) & 3;
    pGVar8->gct = '\x04';
    pGVar8->len = uVar12;
    pGVar8->hash = hashc;
    pcVar1 = (char *)(uVar3 + 0xac);
    cVar2 = *pcVar1;
    *pcVar1 = *pcVar1 + -1;
    if (cVar2 == '\0') {
      uVar9 = lj_prng_u64((PRNGState *)(uVar3 + 0x188));
      *(char *)(uVar3 + 0xac) = (char)(uVar9 >> 0x38);
    }
    else {
      uVar9 = (uint64_t)*(uint *)(uVar3 + 0xa8);
    }
    *(StrID *)(uVar3 + 0xa8) = (StrID)uVar9 + 1;
    pGVar8->sid = (StrID)uVar9;
    pGVar8->reserved = '\0';
    pGVar8->hashalg = uVar6;
    *(undefined4 *)((long)&pGVar8[1].nextgc.gcptr64 + (ulong)(uVar12 & 0x7ffffffc)) = 0;
    memcpy(pGVar8 + 1,str,lenx);
    uVar10 = *(uint *)(uVar3 + 0xa0);
    lVar4 = *(long *)(uVar3 + 0x98);
    uVar5 = *(ulong *)(lVar4 + (ulong)(hashc & uVar10) * 8);
    (pGVar8->nextgc).gcptr64 = uVar5 & 0xfffffffffffffffe;
    *(ulong *)(lVar4 + (ulong)(hashc & uVar10) * 8) = (ulong)((uint)uVar5 & 1) | (ulong)pGVar8;
    uVar12 = *(uint *)(uVar3 + 0xa4);
    *(uint *)(uVar3 + 0xa4) = uVar12 + 1;
    if (uVar10 < uVar12) {
      lj_str_resize(L,uVar10 * 2 + 1);
    }
  }
  else {
    if (lenx != 0) {
      lj_err_msg(L,LJ_ERR_STROV);
    }
    pGVar8 = (GCstr *)(uVar3 + 0x78);
  }
  return pGVar8;
}

Assistant:

GCstr *lj_str_new(lua_State *L, const char *str, size_t lenx)
{
  global_State *g = G(L);
  if (lenx-1 < LJ_MAX_STR-1) {
    MSize len = (MSize)lenx;
    StrHash hash = hash_sparse(g->str.seed, str, len);
    MSize coll = 0;
    int hashalg = 0;
    /* Check if the string has already been interned. */
    GCobj *o = gcref(g->str.tab[hash & g->str.mask]);
#if LUAJIT_SECURITY_STRHASH
    if (LJ_UNLIKELY((uintptr_t)o & 1)) {  /* Secondary hash for this chain? */
      hashalg = 1;
      hash = hash_dense(g->str.seed, hash, str, len);
      o = (GCobj *)(gcrefu(g->str.tab[hash & g->str.mask]) & ~(uintptr_t)1);
    }
#endif
    while (o != NULL) {
      GCstr *sx = gco2str(o);
      if (sx->hash == hash && sx->len == len) {
	if (memcmp(str, strdata(sx), len) == 0) {
	  if (isdead(g, o)) flipwhite(o);  /* Resurrect if dead. */
	  return sx;  /* Return existing string. */
	}
	coll++;
      }
      coll++;
      o = gcnext(o);
    }
#if LUAJIT_SECURITY_STRHASH
    /* Rehash chain if there are too many collisions. */
    if (LJ_UNLIKELY(coll > LJ_STR_MAXCOLL) && !hashalg) {
      return lj_str_rehash_chain(L, hash, str, len);
    }
#endif
    /* Otherwise allocate a new string. */
    return lj_str_alloc(L, str, len, hash, hashalg);
  } else {
    if (lenx)
      lj_err_msg(L, LJ_ERR_STROV);
    return &g->strempty;
  }
}